

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

double duckdb::NoInfiniteDoubleWrapper<duckdb::SinOperator>::Operation<double,double>(double input)

{
  undefined8 uVar1;
  bool bVar2;
  OutOfRangeException *in_XMM0_Qa;
  allocator local_31;
  string local_30 [16];
  double in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  OutOfRangeException *local_8;
  
  bVar2 = Value::IsFinite<double>(1.69816474067675e-316);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_8 = (OutOfRangeException *)SinOperator::Operation<double,double>(1.698176400626e-316);
  }
  else {
    bVar2 = Value::IsNan<double>(1.69816582762118e-316);
    local_8 = in_XMM0_Qa;
    if (!bVar2) {
      uVar1 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_30,"input value %lf is out of range for numeric function",&local_31);
      OutOfRangeException::OutOfRangeException<double>
                (in_XMM0_Qa,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      __cxa_throw(uVar1,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  return (double)local_8;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}